

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::replace
          (QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype i,
          parameter_type t)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (_func_QVariant_void_ptr_void_ptr_double **)0x0;
  local_38.size = 0;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::detach(&this->d,&local_38);
  (this->d).ptr[i] = t;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::~QArrayDataPointer(&local_38)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, parameter_type t)
    {
        Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
        DataPointer oldData;
        d.detach(&oldData);
        d.data()[i] = t;
    }